

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall
Js::ModuleRoot::DeleteProperty(ModuleRoot *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  PropertyIndex PVar1;
  BOOL BVar2;
  HostObjectBase **ppHVar3;
  RecyclableObject *this_00;
  HostObjectBase *pHVar4;
  JavascriptLibrary *this_01;
  GlobalObject *this_02;
  int index;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  PVar1 = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (PVar1 == 0xffff) {
    ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar3 != (HostObjectBase *)0x0) {
      this_00 = (RecyclableObject *)
                Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                          (&(this->super_RootObjectBase).hostObject);
      BVar2 = RecyclableObject::HasProperty(this_00,propertyId);
      if (BVar2 != 0) {
        pHVar4 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                           (&(this->super_RootObjectBase).hostObject);
        BVar2 = (**(code **)(*(long *)pHVar4 + 0x108))(pHVar4,propertyId,flags);
        return BVar2;
      }
    }
    this_01 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_02 = JavascriptLibrary::GetGlobalObject(this_01);
    this_local._4_4_ = GlobalObject::DeleteProperty(this_02,propertyId,flags);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleRoot::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        int index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            return FALSE;
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->DeleteProperty(propertyId, flags);
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::DeleteProperty(propertyId, flags);
    }